

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

void cmsysProcess_Kill(cmsysProcess *cp)

{
  __pid_t _Var1;
  int *piVar2;
  long lVar3;
  int status;
  int local_1c;
  
  if ((cp != (cmsysProcess *)0x0) && (cp->State == 3)) {
    kwsysProcessCleanupDescriptor(&cp->SignalPipe);
    kwsysProcessClosePipes(cp);
    cp->Killed = 1;
    for (lVar3 = 0; lVar3 < cp->NumberOfCommands; lVar3 = lVar3 + 1) {
      if (cp->ForkPIDs[lVar3] != 0) {
        kwsysProcessKill(cp->ForkPIDs[lVar3]);
        do {
          _Var1 = waitpid(cp->ForkPIDs[lVar3],&local_1c,0);
          if (-1 < _Var1) break;
          piVar2 = __errno_location();
        } while (*piVar2 == 4);
      }
    }
    cp->CommandsLeft = 0;
  }
  return;
}

Assistant:

void kwsysProcess_Kill(kwsysProcess* cp)
{
  int i;

  /* Make sure we are executing a process.  */
  if(!cp || cp->State != kwsysProcess_State_Executing)
    {
    return;
    }

  /* First close the child exit report pipe write end to avoid causing a
     SIGPIPE when the child terminates and our signal handler tries to
     report it after we have already closed the read end.  */
  kwsysProcessCleanupDescriptor(&cp->SignalPipe);

#if !defined(__APPLE__)
  /* Close all the pipe read ends.  Do this before killing the
     children because Cygwin has problems killing processes that are
     blocking to wait for writing to their output pipes.  */
  kwsysProcessClosePipes(cp);
#endif

  /* Kill the children.  */
  cp->Killed = 1;
  for(i=0; i < cp->NumberOfCommands; ++i)
    {
    int status;
    if(cp->ForkPIDs[i])
      {
      /* Kill the child.  */
      kwsysProcessKill(cp->ForkPIDs[i]);

      /* Reap the child.  Keep trying until the call is not
         interrupted.  */
      while((waitpid(cp->ForkPIDs[i], &status, 0) < 0) && (errno == EINTR));
      }
    }

#if defined(__APPLE__)
  /* Close all the pipe read ends.  Do this after killing the
     children because OS X has problems closing pipe read ends whose
     pipes are full and still have an open write end.  */
  kwsysProcessClosePipes(cp);
#endif

  cp->CommandsLeft = 0;
}